

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

void lodepng_info_init(LodePNGInfo *info)

{
  (info->color).key_defined = 0;
  (info->color).key_r = 0;
  (info->color).key_g = 0;
  (info->color).key_b = 0;
  (info->color).colortype = LCT_RGBA;
  (info->color).bitdepth = 8;
  (info->color).palette = (uchar *)0x0;
  (info->color).palettesize = 0;
  info->interlace_method = 0;
  info->compression_method = 0;
  info->filter_method = 0;
  info->phys_defined = 0;
  info->background_defined = 0;
  info->background_r = 0;
  info->background_g = 0;
  info->background_b = 0;
  info->text_num = 0;
  info->text_keys = (char **)0x0;
  info->text_strings = (char **)0x0;
  info->itext_num = 0;
  info->itext_keys = (char **)0x0;
  info->itext_langtags = (char **)0x0;
  info->itext_transkeys = (char **)0x0;
  info->itext_strings = (char **)0x0;
  info->time_defined = 0;
  LodePNGUnknownChunks_init(info);
  return;
}

Assistant:

void lodepng_color_mode_init(LodePNGColorMode* info)
{
  info->key_defined = 0;
  info->key_r = info->key_g = info->key_b = 0;
  info->colortype = LCT_RGBA;
  info->bitdepth = 8;
  info->palette = 0;
  info->palettesize = 0;
}